

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O3

uLong adler32_combine_(uLong adler1,uLong adler2,long len2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = adler1 & 0xffff;
  uVar1 = ((ulong)len2 % 0xfff1) * uVar2;
  lVar4 = (((adler2 >> 0x10 & 0xffff) + (adler1 >> 0x10 & 0xffff)) - (ulong)len2 % 0xfff1) +
          (ulong)(uint)((int)uVar1 + (int)(uVar1 / 0xfff1) * -0xfff1);
  uVar1 = lVar4 + 0xfff1;
  uVar3 = 0xfff0;
  if (0xfff0 < (int)uVar2 + (int)(adler2 & 0xffff) + 0xfff0U) {
    uVar3 = (uVar2 - 1) + (adler2 & 0xffff);
  }
  uVar2 = uVar3 - 0xfff1;
  if (uVar3 < 0xfff1) {
    uVar2 = uVar3;
  }
  uVar3 = lVar4 - 0xfff1;
  if (uVar1 < 0x1ffe2) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 * 0x10000 - 0xfff10000;
  if (uVar3 < 0xfff1) {
    uVar1 = uVar3 * 0x10000;
  }
  return uVar1 | uVar2;
}

Assistant:

local uLong adler32_combine_(uLong adler1, uLong adler2, z_off64_t len2)
{
    unsigned long sum1;
    unsigned long sum2;
    unsigned rem;

    /* the derivation of this formula is left as an exercise for the reader */
    rem = (unsigned)(len2 % BASE);
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum2 >= (BASE << 1)) sum2 -= (BASE << 1);
    if (sum2 >= BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}